

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall
anon_unknown.dwarf_2a6a20::InferPubkey
          (anon_unknown_dwarf_2a6a20 *this,CPubKey *pubkey,ParseScriptContext ctx,
          SigningProvider *provider)

{
  byte bVar1;
  void *pvVar2;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  pointer __p;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  long in_FS_OFFSET;
  undefined4 local_60 [2];
  void *local_58;
  undefined8 uStack_50;
  long local_48;
  CKeyID local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pubkey->vch[0];
  bVar8 = 1;
  if ((bVar1 & 0xfe) != 2) {
    if (bVar1 < 8) {
      bVar8 = 0xd0 >> (bVar1 & 0x1f);
    }
    else {
      bVar8 = 0;
    }
  }
  if ((((byte)(bVar1 - 2) < 3 & bVar8) == 0) || (P2SH < ctx && (bVar1 & 0xfe) != 2)) {
    *(undefined8 *)this = 0;
  }
  else {
    puVar6 = (undefined8 *)operator_new(0x50);
    *(undefined4 *)(puVar6 + 1) = 0;
    *puVar6 = &PTR__PubkeyProvider_003dc498;
    memcpy((void *)((long)puVar6 + 0xc),pubkey,0x41);
    *(undefined1 *)((long)puVar6 + 0x4d) = 0;
    local_58 = (void *)0x0;
    uStack_50 = 0;
    local_48 = 0;
    CPubKey::GetID(&local_40,pubkey);
    iVar5 = (*provider->_vptr_SigningProvider[7])(provider,&local_40,local_60);
    if ((char)iVar5 == '\0') {
      *(undefined8 **)this = puVar6;
    }
    else {
      puVar7 = (undefined8 *)operator_new(0x40);
      lVar4 = local_48;
      uVar3 = uStack_50;
      pvVar2 = local_58;
      local_58 = (void *)0x0;
      uStack_50 = 0;
      local_48 = 0;
      *(undefined4 *)(puVar7 + 1) = 0;
      *puVar7 = &PTR__OriginPubkeyProvider_003dc628;
      *(undefined4 *)(puVar7 + 2) = local_60[0];
      puVar7[3] = pvVar2;
      puVar7[4] = uVar3;
      puVar7[5] = lVar4;
      puVar7[6] = puVar6;
      *(undefined1 *)(puVar7 + 7) = 0;
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[0] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[1] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[2] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[3] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[4] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[5] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[6] = '\0';
      local_40.super_uint160.super_base_blob<160U>.m_data._M_elems[7] = '\0';
      *(undefined8 **)this = puVar7;
      std::
      unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
      ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                     *)&local_40);
    }
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,local_48 - (long)local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferPubkey(const CPubKey& pubkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    // Key cannot be hybrid
    if (!pubkey.IsValidNonHybrid()) {
        return nullptr;
    }
    // Uncompressed is only allowed in TOP and P2SH contexts
    if (ctx != ParseScriptContext::TOP && ctx != ParseScriptContext::P2SH && !pubkey.IsCompressed()) {
        return nullptr;
    }
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, false);
    KeyOriginInfo info;
    if (provider.GetKeyOrigin(pubkey.GetID(), info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}